

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void google::protobuf::compiler::python::anon_unknown_0::PrintDescriptorOptionsFixingCode
               (string *descriptor,string *options,Printer *printer)

{
  io::Printer::Print(printer,"$descriptor$.has_options = True\n$descriptor$._options = $options$\n",
                     "descriptor",descriptor,"options",options);
  return;
}

Assistant:

void PrintDescriptorOptionsFixingCode(const string& descriptor,
                                      const string& options,
                                      io::Printer* printer) {
  // TODO(xiaofeng): I have added a method _SetOptions() to DescriptorBase
  // in proto2 python runtime but it couldn't be used here because appengine
  // uses a snapshot version of the library in which the new method is not
  // yet present. After appengine has synced their runtime library, the code
  // below should be cleaned up to use _SetOptions().
  printer->Print(
      "$descriptor$.has_options = True\n"
      "$descriptor$._options = $options$\n",
      "descriptor", descriptor, "options", options);
}